

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

ngx_int_t ngx_memn2cmp(u_char *s1,u_char *s2,size_t n1,size_t n2)

{
  int iVar1;
  size_t __n;
  long lVar2;
  
  __n = n2;
  if (n1 < n2) {
    __n = n1;
  }
  iVar1 = memcmp(s1,s2,__n);
  lVar2 = (ulong)(n2 < n1) * 2 + -1;
  if (iVar1 != 0) {
    lVar2 = (long)iVar1;
  }
  if (n1 == n2) {
    lVar2 = (long)iVar1;
  }
  return lVar2;
}

Assistant:

ngx_int_t
ngx_memn2cmp(u_char *s1, u_char *s2, size_t n1, size_t n2)
{
    size_t     n;
    ngx_int_t  m, z;

    if (n1 <= n2) {
        n = n1;
        z = -1;

    } else {
        n = n2;
        z = 1;
    }

    m = ngx_memcmp(s1, s2, n);

    if (m || n1 == n2) {
        return m;
    }

    return z;
}